

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void expand_vec_sari(TCGContext_conflict9 *tcg_ctx,TCGType_conflict type,uint vece,TCGv_vec v0,
                    TCGv_vec v1,TCGArg imm)

{
  TCGv_vec v;
  TCGv_vec pTVar1;
  TCGArg TVar2;
  TCGArg TVar3;
  TCGArg TVar4;
  TCGArg local_c8;
  TCGv_vec t2;
  TCGv_vec t1;
  TCGArg imm_local;
  TCGv_vec v1_local;
  TCGv_vec v0_local;
  uint vece_local;
  TCGType_conflict type_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  if (vece == 0) {
    pTVar1 = tcg_temp_new_vec_tricore(tcg_ctx,type);
    v = tcg_temp_new_vec_tricore(tcg_ctx,type);
    TVar2 = tcgv_vec_arg(tcg_ctx,pTVar1);
    TVar3 = tcgv_vec_arg(tcg_ctx,v1);
    TVar4 = tcgv_vec_arg(tcg_ctx,v1);
    vec_gen_3_tricore(tcg_ctx,INDEX_op_x86_punpckl_vec,type,0,TVar2,TVar3,TVar4);
    TVar2 = tcgv_vec_arg(tcg_ctx,v);
    TVar3 = tcgv_vec_arg(tcg_ctx,v1);
    TVar4 = tcgv_vec_arg(tcg_ctx,v1);
    vec_gen_3_tricore(tcg_ctx,INDEX_op_x86_punpckh_vec,type,0,TVar2,TVar3,TVar4);
    tcg_gen_sari_vec_tricore(tcg_ctx,1,pTVar1,pTVar1,imm + 8);
    tcg_gen_sari_vec_tricore(tcg_ctx,1,v,v,imm + 8);
    TVar2 = tcgv_vec_arg(tcg_ctx,v0);
    TVar3 = tcgv_vec_arg(tcg_ctx,pTVar1);
    TVar4 = tcgv_vec_arg(tcg_ctx,v);
    vec_gen_3_tricore(tcg_ctx,INDEX_op_x86_packss_vec,type,0,TVar2,TVar3,TVar4);
    tcg_temp_free_vec(tcg_ctx,pTVar1);
    tcg_temp_free_vec(tcg_ctx,v);
  }
  else {
    if (vece != 3) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
                 ,0xd3c,(char *)0x0);
    }
    if (imm < 0x21) {
      pTVar1 = tcg_temp_new_vec_tricore(tcg_ctx,type);
      local_c8 = imm;
      if (0x1e < imm) {
        local_c8 = 0x1f;
      }
      tcg_gen_sari_vec_tricore(tcg_ctx,2,pTVar1,v1,local_c8);
      tcg_gen_shri_vec_tricore(tcg_ctx,3,v0,v1,imm);
      TVar2 = tcgv_vec_arg(tcg_ctx,v0);
      TVar3 = tcgv_vec_arg(tcg_ctx,v0);
      TVar4 = tcgv_vec_arg(tcg_ctx,pTVar1);
      vec_gen_4_tricore(tcg_ctx,INDEX_op_x86_blend_vec,type,2,TVar2,TVar3,TVar4,0xaa);
      tcg_temp_free_vec(tcg_ctx,pTVar1);
    }
    else {
      pTVar1 = tcg_const_zeros_vec_tricore(tcg_ctx,type);
      tcg_gen_cmp_vec_tricore(tcg_ctx,TCG_COND_GT,3,pTVar1,pTVar1,v1);
      tcg_gen_shri_vec_tricore(tcg_ctx,3,v0,v1,imm);
      tcg_gen_shli_vec_tricore(tcg_ctx,3,pTVar1,pTVar1,0x40 - imm);
      tcg_gen_or_vec_tricore(tcg_ctx,3,v0,v0,pTVar1);
      tcg_temp_free_vec(tcg_ctx,pTVar1);
    }
  }
  return;
}

Assistant:

static void expand_vec_sari(TCGContext *tcg_ctx, TCGType type, unsigned vece,
                            TCGv_vec v0, TCGv_vec v1, TCGArg imm)
{
    TCGv_vec t1, t2;

    switch (vece) {
    case MO_8:
        /* Unpack to W, shift, and repack, as in expand_vec_shi.  */
        t1 = tcg_temp_new_vec(tcg_ctx, type);
        t2 = tcg_temp_new_vec(tcg_ctx, type);
        vec_gen_3(tcg_ctx, INDEX_op_x86_punpckl_vec, type, MO_8,
                  tcgv_vec_arg(tcg_ctx, t1), tcgv_vec_arg(tcg_ctx, v1), tcgv_vec_arg(tcg_ctx, v1));
        vec_gen_3(tcg_ctx, INDEX_op_x86_punpckh_vec, type, MO_8,
                  tcgv_vec_arg(tcg_ctx, t2), tcgv_vec_arg(tcg_ctx, v1), tcgv_vec_arg(tcg_ctx, v1));
        tcg_gen_sari_vec(tcg_ctx, MO_16, t1, t1, imm + 8);
        tcg_gen_sari_vec(tcg_ctx, MO_16, t2, t2, imm + 8);
        vec_gen_3(tcg_ctx, INDEX_op_x86_packss_vec, type, MO_8,
                  tcgv_vec_arg(tcg_ctx, v0), tcgv_vec_arg(tcg_ctx, t1), tcgv_vec_arg(tcg_ctx, t2));
        tcg_temp_free_vec(tcg_ctx, t1);
        tcg_temp_free_vec(tcg_ctx, t2);
        break;

    case MO_64:
        if (imm <= 32) {
            /*
             * We can emulate a small sign extend by performing an arithmetic
             * 32-bit shift and overwriting the high half of a 64-bit logical
             * shift.  Note that the ISA says shift of 32 is valid, but TCG
             * does not, so we have to bound the smaller shift -- we get the
             * same result in the high half either way.
             */
            t1 = tcg_temp_new_vec(tcg_ctx, type);
            tcg_gen_sari_vec(tcg_ctx, MO_32, t1, v1, MIN(imm, 31));
            tcg_gen_shri_vec(tcg_ctx, MO_64, v0, v1, imm);
            vec_gen_4(tcg_ctx, INDEX_op_x86_blend_vec, type, MO_32,
                      tcgv_vec_arg(tcg_ctx, v0), tcgv_vec_arg(tcg_ctx, v0),
                      tcgv_vec_arg(tcg_ctx, t1), 0xaa);
            tcg_temp_free_vec(tcg_ctx, t1);
        } else {
            /* Otherwise we will need to use a compare vs 0 to produce
             * the sign-extend, shift and merge.
             */
            t1 = tcg_const_zeros_vec(tcg_ctx, type);
            tcg_gen_cmp_vec(tcg_ctx, TCG_COND_GT, MO_64, t1, t1, v1);
            tcg_gen_shri_vec(tcg_ctx, MO_64, v0, v1, imm);
            tcg_gen_shli_vec(tcg_ctx, MO_64, t1, t1, 64 - imm);
            tcg_gen_or_vec(tcg_ctx, MO_64, v0, v0, t1);
            tcg_temp_free_vec(tcg_ctx, t1);
        }
        break;

    default:
        g_assert_not_reached();
    }
}